

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> *nameStack)

{
  pointer pSVar1;
  long *plVar2;
  size_type sVar3;
  long *plVar4;
  pointer pSVar5;
  long *local_70;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pSVar5 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      if ((pSVar5->field_0).buf[0x17] < '\0') {
        sVar3 = (pSVar5->field_0).data.size;
      }
      else {
        sVar3 = 0x17 - ((byte)(pSVar5->field_0).buf[0x17] & 0x1f);
      }
      if (sVar3 != 0) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
        plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar2[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&(this->testcases).
                            super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].name,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  return;
}

Assistant:

void filloss(std::ostream* stream, const T (&in)[N]) { // NOLINT(*-avoid-c-arrays)
        // T[N], T(&)[N], T(&&)[N] have same behaviour.
        // Hence remove reference.
        filloss<typename types::remove_reference<decltype(in)>::type>(stream, in);
    }